

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.hpp
# Opt level: O2

bool ruckig::Block::calculate_block<6ul,true>
               (Block *block,array<ruckig::Profile,_6UL> *valid_profiles,
               size_t valid_profile_counter)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  Profile *pPVar4;
  long lVar5;
  size_t index;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  size_t valid_profile_counter_local;
  Interval local_280;
  
  index = 3;
  valid_profile_counter_local = valid_profile_counter;
  if (valid_profile_counter == 4) {
    dVar1 = valid_profiles->_M_elems[0].t_sum._M_elems[6];
    if ((7.105427357601002e-15 <= ABS(dVar1 - valid_profiles->_M_elems[1].t_sum._M_elems[6])) ||
       (valid_profiles->_M_elems[0].direction == valid_profiles->_M_elems[1].direction)) {
      dVar2 = valid_profiles->_M_elems[3].t_sum._M_elems[6];
      if (((ABS(valid_profiles->_M_elems[2].t_sum._M_elems[6] - dVar2) < 5.6843418860808015e-14) &&
          (valid_profiles->_M_elems[2].direction != valid_profiles->_M_elems[3].direction)) ||
         ((ABS(dVar1 - dVar2) < 5.6843418860808015e-14 &&
          (valid_profiles->_M_elems[0].direction != valid_profiles->_M_elems[3].direction))))
      goto LAB_00165b34;
    }
    else {
      index = 1;
LAB_00165b34:
      remove_profile<6ul>(valid_profiles,&valid_profile_counter_local,index);
LAB_00165b3f:
      pPVar4 = std::
               __min_element<ruckig::Profile_const*,__gnu_cxx::__ops::_Iter_comp_iter<ruckig::Block::calculate_block<6ul,true>(ruckig::Block&,std::array<ruckig::Profile,6ul>&,unsigned_long)::_lambda(ruckig::Profile_const&,ruckig::Profile_const&)_1_>>
                         (valid_profiles,valid_profiles->_M_elems + valid_profile_counter_local);
      lVar5 = ((long)pPVar4 - (long)valid_profiles) / 0x240;
      set_min_profile(block,valid_profiles->_M_elems + lVar5);
      if (valid_profile_counter_local == 5) {
        uVar6 = (lVar5 + 1U) % 5;
        uVar7 = (lVar5 + 2U) % 5;
        uVar8 = (lVar5 + 3U) % 5;
        uVar9 = (lVar5 + 4U) % 5;
        if (valid_profiles->_M_elems[uVar6].direction == valid_profiles->_M_elems[uVar7].direction)
        {
          Interval::Interval(&local_280,valid_profiles->_M_elems + uVar6,
                             valid_profiles->_M_elems + uVar7);
          bVar3 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                  super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
          memcpy(&block->a,&local_280,0x250);
          if (bVar3 == false) {
            (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
            super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
          }
          Interval::Interval(&local_280,valid_profiles->_M_elems + uVar8,
                             valid_profiles->_M_elems + uVar9);
          cVar10 = (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
        }
        else {
          Interval::Interval(&local_280,valid_profiles->_M_elems + uVar6,
                             valid_profiles->_M_elems + uVar9);
          bVar3 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                  super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
          memcpy(&block->a,&local_280,0x250);
          if (bVar3 == false) {
            (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
            super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
          }
          Interval::Interval(&local_280,valid_profiles->_M_elems + uVar7,
                             valid_profiles->_M_elems + uVar8);
          cVar10 = (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
        }
        memcpy(&block->b,&local_280,0x250);
        if (cVar10 == '\0') {
          (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
        }
        goto LAB_00165d48;
      }
      if (valid_profile_counter_local == 3) {
        uVar6 = (lVar5 + 2U) % 3;
        pPVar4 = valid_profiles->_M_elems + (lVar5 + 1U) % 3;
        goto LAB_00165bb9;
      }
    }
LAB_00165bee:
    bVar3 = false;
  }
  else {
    if (valid_profile_counter == 2) {
      dVar1 = valid_profiles->_M_elems[0].t_sum._M_elems[6];
      dVar2 = valid_profiles->_M_elems[1].t_sum._M_elems[6];
      if (ABS(dVar1 - dVar2) < 1.7763568394002505e-15) goto LAB_00165a38;
      uVar6 = (ulong)(dVar1 < dVar2);
      pPVar4 = valid_profiles->_M_elems + (dVar2 <= dVar1);
      set_min_profile(block,pPVar4);
LAB_00165bb9:
      Interval::Interval(&local_280,pPVar4,valid_profiles->_M_elems + uVar6);
      bVar3 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
              super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
      memcpy(&block->a,&local_280,0x250);
      if (bVar3 == false) {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
      }
    }
    else {
      if (valid_profile_counter != 1) {
        if ((valid_profile_counter & 1) == 0) goto LAB_00165bee;
        goto LAB_00165b3f;
      }
LAB_00165a38:
      set_min_profile(block,valid_profiles->_M_elems);
    }
LAB_00165d48:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool calculate_block(Block& block, std::array<Profile, N>& valid_profiles, size_t valid_profile_counter) {
        // std::cout << "---\n " << valid_profile_counter << std::endl;
        // for (size_t i = 0; i < valid_profile_counter; ++i) {
        //     std::cout << valid_profiles[i].t_sum.back() << " " << valid_profiles[i].to_string() << std::endl;
        // }

        if (valid_profile_counter == 1) {
            block.set_min_profile(valid_profiles[0]);
            return true;

        } else if (valid_profile_counter == 2) {
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 8 * std::numeric_limits<double>::epsilon()) {
                block.set_min_profile(valid_profiles[0]);
                return true;
            }

            if constexpr (numerical_robust) {
                const size_t idx_min = (valid_profiles[0].t_sum.back() < valid_profiles[1].t_sum.back()) ? 0 : 1;
                const size_t idx_else_1 = (idx_min + 1) % 2;

                block.set_min_profile(valid_profiles[idx_min]);
                block.a = Interval(valid_profiles[idx_min], valid_profiles[idx_else_1]);
                return true;
            }

        // Only happens due to numerical issues
        } else if (valid_profile_counter == 4) {
            // Find "identical" profiles
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 32 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[1].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 1);
            } else if (std::abs(valid_profiles[2].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[2].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else {
                return false;
            }

        } else if (valid_profile_counter % 2 == 0) {
            return false;
        }

        // Find index of fastest profile
        const auto idx_min_it = std::min_element(valid_profiles.cbegin(), valid_profiles.cbegin() + valid_profile_counter, [](const Profile& a, const Profile& b) { return a.t_sum.back() < b.t_sum.back(); });
        const size_t idx_min = std::distance(valid_profiles.cbegin(), idx_min_it);

        block.set_min_profile(valid_profiles[idx_min]);

        if (valid_profile_counter == 3) {
            const size_t idx_else_1 = (idx_min + 1) % 3;
            const size_t idx_else_2 = (idx_min + 2) % 3;

            block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
            return true;

        } else if (valid_profile_counter == 5) {
            const size_t idx_else_1 = (idx_min + 1) % 5;
            const size_t idx_else_2 = (idx_min + 2) % 5;
            const size_t idx_else_3 = (idx_min + 3) % 5;
            const size_t idx_else_4 = (idx_min + 4) % 5;

            if (valid_profiles[idx_else_1].direction == valid_profiles[idx_else_2].direction) {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
                block.b = Interval(valid_profiles[idx_else_3], valid_profiles[idx_else_4]);
            } else {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_4]);
                block.b = Interval(valid_profiles[idx_else_2], valid_profiles[idx_else_3]);
            }
            return true;
        }

        return false;
    }